

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassicSudokuVisualizer.cpp
# Opt level: O2

string * __thiscall
ClassicSudokuVisualizer::createCells_abi_cxx11_
          (string *__return_storage_ptr__,ClassicSudokuVisualizer *this)

{
  uint uVar1;
  uint uVar2;
  cell cVar3;
  uint __val;
  uint column;
  uint row;
  string local_50;
  
  uVar1 = (this->gitter).elements;
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_50);
  uVar2 = 0;
  for (row = 0; row != uVar1; row = row + 1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    for (column = 0; __val = uVar2 + column, uVar1 != column; column = column + 1) {
      cVar3 = SudokuGitter::getCell(&this->gitter,row,column);
      if (cVar3.value == 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::to_string(&local_50,__val);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::to_string(&local_50,__val);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::to_string(&local_50,cVar3.value);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_50);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar2 = __val;
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string ClassicSudokuVisualizer::createCells() {
    unsigned int size = gitter.getElements();

    std::string cells = "";

    unsigned int counter = 0;
    for (unsigned int row = 0; row < size; row++) {
        cells.append("<tr>");
        for (unsigned int col = 0; col < size; col++) {
            unsigned int num = gitter.getCell(row, col).value;
            if (num > 0) {
                cells.append("<td><input id='cell-");
                cells.append(std::to_string(counter));
                cells.append("' type='text' value='");
                cells.append(std::to_string(num));
                cells.append("' disabled></td>");
            } else {
                cells.append("<td><input id='cell-");
                cells.append(std::to_string(counter));
                cells.append("' type='text'></td>");
            }
            counter++;
        }
        cells.append("</tr>");
    }

    return cells;
}